

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

bool Diligent::StreqSuff(char *RefStr,char *Str,char *Suff,bool NoSuffixAllowed)

{
  int iVar1;
  Char *pCVar2;
  undefined7 in_register_00000009;
  bool bVar3;
  undefined1 local_90 [8];
  string msg_1;
  char *s;
  char *r;
  undefined1 local_50 [8];
  string msg;
  bool NoSuffixAllowed_local;
  char *Suff_local;
  char *Str_local;
  char *RefStr_local;
  
  msg.field_2._M_local_buf[0xf] = NoSuffixAllowed;
  if ((RefStr == (char *)0x0) || (Str == (char *)0x0)) {
    FormatString<char[26],char[36]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RefStr != nullptr && Str != nullptr",
               (char (*) [36])CONCAT71(in_register_00000009,NoSuffixAllowed));
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"StreqSuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringTools.hpp"
               ,0x76);
    std::__cxx11::string::~string((string *)local_50);
  }
  msg_1.field_2._8_8_ = Str;
  s = RefStr;
  if (RefStr != (char *)0x0) {
    while( true ) {
      bVar3 = false;
      if ((int)*s != 0) {
        bVar3 = *(char *)msg_1.field_2._8_8_ != '\0';
      }
      if (!bVar3) {
        if (*(char *)msg_1.field_2._8_8_ != '\0') {
          if (*s != '\0') {
            FormatString<char[26],char[8]>
                      ((string *)local_90,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"*r == 0",(char (*) [8])(ulong)(uint)(int)*s);
            pCVar2 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar2,"StreqSuff",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringTools.hpp"
                       ,0x8f);
            std::__cxx11::string::~string((string *)local_90);
          }
          return false;
        }
        if (((msg.field_2._M_local_buf[0xf] & 1U) != 0) && (*s == '\0')) {
          return true;
        }
        if (Suff == (char *)0x0) {
          return *s == '\0';
        }
        iVar1 = strcmp(s,Suff);
        return iVar1 == 0;
      }
      if (*s != *(char *)msg_1.field_2._8_8_) break;
      s = s + 1;
      msg_1.field_2._8_8_ = msg_1.field_2._8_8_ + 1;
    }
  }
  return false;
}

Assistant:

inline bool StreqSuff(const char* RefStr, const char* Str, const char* Suff, bool NoSuffixAllowed = false)
{
    VERIFY_EXPR(RefStr != nullptr && Str != nullptr);
    if (RefStr == nullptr)
        return false;

    const auto* r = RefStr;
    const auto* s = Str;
    // abc_def     abc
    // ^           ^
    // r           s
    for (; *r != 0 && *s != 0; ++r, ++s)
    {
        if (*r != *s)
        {
            // abc_def     abx
            //   ^           ^
            //   r           s
            return false;
        }
    }

    if (*s != 0)
    {
        // ab         abc
        //   ^          ^
        //   r          s
        VERIFY_EXPR(*r == 0);
        return false;
    }
    else
    {
        // abc_def     abc
        //    ^           ^
        //    r           s

        if (NoSuffixAllowed && *r == 0)
        {
            // abc         abc      _def
            //    ^           ^
            //    r           s
            return true;
        }

        if (Suff != nullptr)
        {
            // abc_def     abc       _def
            //    ^           ^      ^
            //    r           s      Suff
            return strcmp(r, Suff) == 0;
        }
        else
        {
            // abc         abc                abc_def         abc
            //    ^           ^       or         ^               ^
            //    r           s                  r               s
            return *r == 0;
        }
    }
}